

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenString(Lexer *this)

{
  int iVar1;
  size_t sVar2;
  Token *this_00;
  Lexer *in_RSI;
  Error<pfederc::LexerErrorCode> *local_40;
  Position local_38;
  
  while( true ) {
    nextChar(in_RSI);
    iVar1 = in_RSI->currentChar;
    if (iVar1 == -1) break;
    if (iVar1 == 0x22) {
      nextChar(in_RSI);
      getCurrentCursor(&local_38,in_RSI);
      this_00 = (Token *)operator_new(0x30);
      Token::Token(this_00,in_RSI->currentToken,TOK_STR,&local_38);
      this->_vptr_Lexer = (_func_int **)this_00;
      return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
             (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
    }
    if ((in_RSI->cfg).multiLineString == false) {
      if (iVar1 == 0x5c) goto LAB_0010767d;
      if ((iVar1 == 10) || (iVar1 == 0xd)) break;
    }
    else if (iVar1 == 0x5c) {
LAB_0010767d:
      nextTokenStringEscapeCode(this);
      if (this->_vptr_Lexer != (_func_int **)0x0) {
        return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
               (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
               this;
      }
    }
  }
  getCurrentCursor(&local_38,in_RSI);
  sVar2 = in_RSI->currentEndIndex;
  local_40 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
  local_40->logLevel = LVL_ERROR;
  local_40->err = LEX_ERR_STR_INVALID_END;
  (local_40->pos).line = local_38.line;
  (local_40->pos).startIndex = sVar2;
  (local_40->pos).endIndex = sVar2;
  (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_40->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                      *)in_RSI);
  if (local_40 != (Error<pfederc::LexerErrorCode> *)0x0) {
    std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_40,local_40);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenString() noexcept {
  nextChar(); // eat "

  while (currentChar != '\"' && currentChar != EOF
      && (cfg.multiLineString || (currentChar != '\r' && currentChar != '\n'))) {
    if (currentChar == '\\') {
      std::unique_ptr<Token> tok(nextTokenStringEscapeCode());
      if (tok)
        return tok; // error forwarding
    }

    nextChar();
  }

  if (currentChar != '\"')
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_STR_INVALID_END, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  nextChar(); // eat "

  return std::make_unique<Token>(currentToken, TokenType::TOK_STR, getCurrentCursor());
}